

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_NewScObjectLiteral
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout)

{
  uint offset;
  FunctionBody *pFVar1;
  PropertyIdArray *propIds_00;
  ScriptContext *scriptContext;
  Type *literalType;
  Var value;
  Var newObj;
  PropertyIdArray *propIds;
  OpLayoutAuxiliary *playout_local;
  InterpreterStackFrame *this_local;
  
  offset = (playout->super_OpLayoutAuxNoReg).Offset;
  pFVar1 = GetFunctionBody(this);
  propIds_00 = ByteCodeReader::ReadPropertyIdArray(offset,pFVar1);
  scriptContext = GetScriptContext(this);
  pFVar1 = GetFunctionBody(this);
  literalType = FunctionBody::GetObjectLiteralTypeRef(pFVar1,(playout->super_OpLayoutAuxNoReg).C1);
  value = Js::JavascriptOperators::NewScObjectLiteral(scriptContext,propIds_00,literalType);
  SetReg<unsigned_int>(this,playout->R0,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScObjectLiteral(const unaligned OpLayoutAuxiliary * playout)
    {
        const Js::PropertyIdArray *propIds = Js::ByteCodeReader::ReadPropertyIdArray(playout->Offset, this->GetFunctionBody());

        Var newObj = JavascriptOperators::NewScObjectLiteral(GetScriptContext(), propIds,
            this->GetFunctionBody()->GetObjectLiteralTypeRef(playout->C1));

        SetReg(playout->R0, newObj);
    }